

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional-main.t.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  
  specification();
  iVar1 = lest::run(&specification::tests,argc,argv,(ostream *)&std::cout);
  return iVar1;
}

Assistant:

int main( int argc, char * argv[] )
{
    return lest::run( specification(), argc, argv );
}